

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<double,unsigned_long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,MissingAction missing_action,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  ulong *puVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  unsigned_long *key;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  unsigned_long uVar8;
  size_t sVar9;
  unsigned_long *puVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar14;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_70;
  double local_68;
  
  uVar8 = Xc_indptr[col_num];
  uVar2 = Xc_indptr[col_num + 1];
  if (uVar8 != uVar2) {
    puVar7 = ix_arr + st;
    local_a8 = 0.0;
    for (sVar9 = st; sVar9 <= end; sVar9 = sVar9 + 1) {
      pVar14 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::try_emplace<unsigned_long_const&>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,puVar7);
      local_a8 = local_a8 + *(double *)((pVar14.first.m_bucket.m_bucket)->m_value + 8);
      puVar7 = puVar7 + 1;
    }
    if (0.0 < local_a8) {
      puVar7 = Xc_ind + uVar2;
      uVar3 = puVar7[-1];
      puVar10 = ix_arr + end + 1;
      key = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                      (ix_arr + st,puVar10,Xc_ind + uVar8);
      if (missing_action == Fail) {
        local_68 = 0.0;
        local_70 = 0.0;
        local_b8 = 0.0;
        local_b0 = 0.0;
LAB_001fe8cc:
        do {
          puVar1 = Xc_ind + uVar8;
          while( true ) {
            if (((key == puVar10) || (uVar8 == uVar2)) || (uVar4 = *key, uVar3 < uVar4))
            goto LAB_001fea91;
            if (*puVar1 == uVar4) {
              pVar14 = tsl::detail_robin_hash::
                       robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                       ::try_emplace<unsigned_long_const&>
                                 ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                   *)w,key);
              dVar12 = *(double *)((pVar14.first.m_bucket.m_bucket)->m_value + 8);
              dVar13 = Xc[uVar8];
              dVar11 = dVar13 * dVar13;
              local_b0 = fma(dVar12,dVar13,local_b0);
              local_b8 = fma(dVar12,dVar11,local_b8);
              local_70 = fma(dVar12,dVar13 * dVar11,local_70);
              local_68 = fma(dVar12,dVar11 * dVar11,local_68);
              if ((key == ix_arr + end) || (uVar8 == uVar2 - 1)) goto LAB_001fea91;
              key = key + 1;
              puVar6 = std::
                       __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                 (puVar1 + 1,puVar7,key);
              uVar8 = (long)puVar6 - (long)Xc_ind >> 3;
              goto LAB_001fe8cc;
            }
            if (*puVar1 <= uVar4) break;
            key = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (key + 1,puVar10,puVar1);
          }
          puVar6 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar1 + 1,puVar7,key);
          uVar8 = (long)puVar6 - (long)Xc_ind >> 3;
        } while( true );
      }
      local_68 = 0.0;
      local_70 = 0.0;
      local_b8 = 0.0;
      local_b0 = 0.0;
LAB_001fe702:
      puVar1 = Xc_ind + uVar8;
      do {
        if (((key == puVar10) || (uVar8 == uVar2)) || (uVar4 = *key, uVar3 < uVar4)) {
LAB_001fea69:
          if (local_a8 <= 0.0) {
            return -INFINITY;
          }
LAB_001fea91:
          if (local_a8 <= 1.0) {
            return -INFINITY;
          }
          if ((local_b8 == 0.0) && (!NAN(local_b8))) {
            return -INFINITY;
          }
          if ((local_b8 == local_b0 * local_b0) && (!NAN(local_b8) && !NAN(local_b0 * local_b0))) {
            return -INFINITY;
          }
          dVar11 = local_b0 / local_a8;
          dVar12 = dVar11 * dVar11;
          dVar13 = local_b8 / local_a8 - dVar12;
          if (NAN(dVar13)) {
            return -INFINITY;
          }
          if ((dVar13 <= 2.220446049250313e-16) &&
             (bVar5 = check_more_than_two_unique_values<double,unsigned_long>
                                (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), !bVar5))
          {
            return -INFINITY;
          }
          if (dVar13 <= 0.0) {
            return 0.0;
          }
          dVar12 = (dVar12 * dVar11 * dVar11 * local_a8 +
                   local_b0 * -4.0 * dVar12 * dVar11 +
                   local_b8 * 6.0 * dVar12 + local_70 * -4.0 * dVar11 + local_68) /
                   (dVar13 * dVar13 * local_a8);
          if (0x7fefffffffffffff < (long)ABS(dVar12)) {
            return -INFINITY;
          }
          if (0.0 < dVar12) {
            return dVar12;
          }
          return 0.0;
        }
        if (*puVar1 == uVar4) {
          pVar14 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::try_emplace<unsigned_long_const&>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key);
          dVar12 = *(double *)((pVar14.first.m_bucket.m_bucket)->m_value + 8);
          dVar13 = Xc[uVar8];
          if ((ulong)ABS(dVar13) < 0x7ff0000000000000) {
            dVar11 = dVar13 * dVar13;
            local_b0 = fma(dVar12,dVar13,local_b0);
            local_b8 = fma(dVar12,dVar11,local_b8);
            local_70 = fma(dVar12,dVar13 * dVar11,local_70);
            local_68 = fma(dVar12,dVar11 * dVar11,local_68);
          }
          else {
            local_a8 = local_a8 - dVar12;
          }
          if ((key == ix_arr + end) || (uVar8 == uVar2 - 1)) goto LAB_001fea69;
          key = key + 1;
          puVar6 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar1 + 1,puVar7,key);
          uVar8 = (long)puVar6 - (long)Xc_ind >> 3;
          goto LAB_001fe702;
        }
        if (*puVar1 <= uVar4) goto LAB_001fe74f;
        key = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                        (key + 1,puVar10,puVar1);
      } while( true );
    }
  }
  return -INFINITY;
LAB_001fe74f:
  puVar6 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (puVar1 + 1,puVar7,key);
  uVar8 = (long)puVar6 - (long)Xc_ind >> 3;
  goto LAB_001fe702;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}